

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O3

void __thiscall duckdb::Pipeline::Print(Pipeline *this)

{
  string local_28;
  
  ToString_abi_cxx11_(&local_28,this);
  Printer::Print((string *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Pipeline::Print() const {
	Printer::Print(ToString());
}